

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O2

uint8_t gb_read_mbc_3(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  undefined6 in_register_00000032;
  
  if (address < 0x4000) {
    puVar3 = mc->rom;
    uVar4 = (ulong)address;
  }
  else {
    iVar5 = (int)CONCAT62(in_register_00000032,address);
    if ((short)address < 0) {
      if ((address & 0xe000) == 0xa000) {
        uVar1 = 0xff;
        if (mc->ram_enabled == true) {
          if (mc->banking_mode == Banking_Mode_ROM) {
            uVar2 = 0;
          }
          else {
            uVar2 = (uint)mc->banking_register_2;
          }
          uVar1 = mc->ram[(uVar2 & mc->ram_bank_mask) << 0xd | iVar5 - 0xa000U];
        }
        return uVar1;
      }
      uVar1 = gb_common_reads(mc,address);
      return uVar1;
    }
    uVar4 = (ulong)((((uint)mc->banking_register_1 | (uint)mc->banking_register_2 << 5) &
                    mc->rom_bank_mask) << 0xe) + (ulong)(iVar5 - 0x4000);
    puVar3 = mc->rom;
  }
  return puVar3[uVar4];
}

Assistant:

uint8_t gb_read_mbc_3(MemoryBankController* mc, uint16_t address) {

    if(address <= 0x3FFF) {
        return mc->rom[address];
    }

    if(address >= 0x4000 && address <= 0x7FFF) {
        int offset = address - ROM_BANK_SIZE;
        int effective_bank = ((mc->banking_register_2 << 5) | (mc->banking_register_1));
        int read_addr = offset + (effective_bank & mc->rom_bank_mask) * ROM_BANK_SIZE;
        return mc->rom[read_addr];
    }
    
    if (address >= 0xA000 && address <= 0xBFFF) {
        if (mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_mode == Banking_Mode_ROM ? 0 : (mc->banking_register_2);
            int read_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            return mc->ram[read_addr];
        }
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}